

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_array.c
# Opt level: O1

void * array_random_new(t_symbol *s,int argc,t_atom *argv)

{
  t_object *owner;
  int in_R9D;
  int in_stack_ffffffffffffffe8;
  int local_14;
  t_atom *local_10;
  
  local_14 = argc;
  local_10 = argv;
  owner = (t_object *)
          array_rangeop_new(array_random_class,(t_symbol *)&stack0xffffffffffffffec,
                            (int *)&stack0xfffffffffffffff0,(t_atom **)0x0,1,in_R9D,
                            in_stack_ffffffffffffffe8);
  array_random_new::random_nextseed = array_random_new::random_nextseed * 0x19fb4787 + 0x37ed14ff;
  *(uint *)&owner[2].te_inlet = array_random_new::random_nextseed;
  outlet_new(owner,&s_float);
  return owner;
}

Assistant:

static void *array_random_new(t_symbol *s, int argc, t_atom *argv)
{
    t_array_random *x = array_rangeop_new(array_random_class, s,
        &argc, &argv, 0, 1, 1);
    static unsigned int random_nextseed = 584926371;
    random_nextseed = random_nextseed * 435898247 + 938284287;
    x->x_state = random_nextseed;
    outlet_new(&x->x_r.x_tc.tc_obj, &s_float);
    return (x);
}